

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O1

HelicsComplex helicsInputGetComplexObject(HelicsInput inp,HelicsError *err)

{
  HelicsInput pvVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  double dVar4;
  HelicsComplex HVar5;
  
  if ((err == (HelicsError *)0x0) || (err->error_code == 0)) {
    if (inp == (HelicsInput)0x0) {
      if (err == (HelicsError *)0x0) goto LAB_001a93b9;
    }
    else {
      pvVar1 = (HelicsInput)0x0;
      if (*inp == 0x3456e052) {
        pvVar1 = inp;
      }
      if (*inp == 0x3456e052 || err == (HelicsError *)0x0) goto LAB_001a93bb;
    }
    err->error_code = -3;
    err->message = "The given input object does not point to a valid object";
  }
LAB_001a93b9:
  pvVar1 = (HelicsInput)0x0;
LAB_001a93bb:
  uVar2 = 0xfaf472ca;
  uVar3 = 0xc814fb89;
  if (pvVar1 == (HelicsInput)0x0) {
    dVar4 = -1.785e+39;
  }
  else {
    helics::Input::getValue_impl<std::complex<double>>(*(Input **)((long)pvVar1 + 0x18));
    uVar2 = 0;
    uVar3 = 0;
    dVar4 = 0.0;
  }
  HVar5.real._4_4_ = uVar3;
  HVar5.real._0_4_ = uVar2;
  HVar5.imag = dVar4;
  return HVar5;
}

Assistant:

HelicsComplex helicsInputGetComplexObject(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);

    if (inpObj == nullptr) {
        // time invalid is just an invalid double
        return {HELICS_TIME_INVALID, HELICS_TIME_INVALID};
    }

    try {
        auto cval = inpObj->inputPtr->getValue<std::complex<double>>();
        return {cval.real(), cval.imag()};
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return {HELICS_TIME_INVALID, HELICS_TIME_INVALID};
    }
    // LCOV_EXCL_STOP
}